

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-base.c
# Opt level: O1

void Curl_async_shutdown(Curl_easy *data)

{
  Curl_async_thrdd_shutdown(data);
  Curl_doh_cleanup(data);
  (*Curl_cfree)((data->state).async.hostname);
  (data->state).async.hostname = (char *)0x0;
  return;
}

Assistant:

void Curl_async_shutdown(struct Curl_easy *data)
{
#ifdef CURLRES_ARES
  Curl_async_ares_shutdown(data);
#endif
#ifdef CURLRES_THREADED
  Curl_async_thrdd_shutdown(data);
#endif
#ifndef CURL_DISABLE_DOH
  Curl_doh_cleanup(data);
#endif
  Curl_safefree(data->state.async.hostname);
}